

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnodeBodySpring::ComputeForce
          (ChLoadXYZnodeBodySpring *this,ChFrameMoving<double> *rel_AB,ChVector<double> *loc_force)

{
  ChCoordsys<double> *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChVector<double> BA;
  ChVector<double> local_48;
  
  this_00 = &(rel_AB->super_ChFrame<double>).coord;
  ChVector<double>::GetNormalized(&local_48,&this_00->pos);
  dVar5 = ChVector<double>::Length(&this_00->pos);
  auVar4._8_8_ = local_48.m_data[1];
  auVar4._0_8_ = local_48.m_data[0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_48.m_data[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (rel_AB->coord_dt).pos.m_data[0];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (rel_AB->coord_dt).pos.m_data[1] * local_48.m_data[1];
  auVar1 = vfmadd231sd_fma(auVar8,auVar4,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (rel_AB->coord_dt).pos.m_data[2];
  auVar1 = vfmadd231sd_fma(auVar1,auVar7,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->K;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar5 - this->d_0;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = auVar1._0_8_ * this->R;
  auVar1 = vfnmsub231sd_fma(auVar9,auVar6,auVar3);
  dVar5 = auVar1._0_8_;
  loc_force->m_data[0] = local_48.m_data[0] * dVar5;
  loc_force->m_data[1] = local_48.m_data[1] * dVar5;
  loc_force->m_data[2] = local_48.m_data[2] * dVar5;
  return;
}

Assistant:

void ChLoadXYZnodeBodySpring:: ComputeForce(const ChFrameMoving<>& rel_AB,
                               ChVector<>& loc_force) {
		ChVector<> BA = rel_AB.GetPos().GetNormalized();
		double d = rel_AB.GetPos().Length() - d_0;
		double d_dt = Vdot(rel_AB.GetPos_dt(), BA);
		loc_force = (-K * d - R * d_dt) * BA;
}